

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

Literal * __thiscall wasm::Literal::bitmaskI16x8(Literal *__return_storage_ptr__,Literal *this)

{
  Literal *this_local;
  
  bitmask<8,_&wasm::Literal::getLanesSI16x8>(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::bitmaskI16x8() const {
  return bitmask<8, &Literal::getLanesSI16x8>(*this);
}